

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local-graph.h
# Opt level: O0

SetInfluences * __thiscall wasm::LocalGraph::getSetInfluences(LocalGraph *this,LocalSet *set)

{
  bool bVar1;
  int iVar2;
  pointer pvVar3;
  _Node_iterator_base<std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>,_false>
  local_30;
  _Node_iterator_base<std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>,_false>
  local_28;
  const_iterator iter;
  LocalSet *set_local;
  LocalGraph *this_local;
  
  iter.
  super__Node_iterator_base<std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>,_false>
             )(_Node_iterator_base<std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>,_false>
               )set;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::LocalSet_*,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>_>_>
       ::find(&this->setInfluences,(key_type *)&iter);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::LocalSet_*,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>_>_>
       ::end(&this->setInfluences);
  bVar1 = std::__detail::operator==(&local_28,&local_30);
  if (bVar1) {
    if (getSetInfluences(wasm::LocalSet*)::empty == '\0') {
      iVar2 = __cxa_guard_acquire(&getSetInfluences(wasm::LocalSet*)::empty);
      if (iVar2 != 0) {
        std::
        unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>
        ::unordered_set(&getSetInfluences::empty);
        __cxa_atexit(std::
                     unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>
                     ::~unordered_set,&getSetInfluences::empty,&__dso_handle);
        __cxa_guard_release(&getSetInfluences(wasm::LocalSet*)::empty);
      }
    }
    this_local = (LocalGraph *)&getSetInfluences::empty;
  }
  else {
    pvVar3 = std::__detail::
             _Node_const_iterator<std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>,_false,_false>
             ::operator->((_Node_const_iterator<std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>,_false,_false>
                           *)&local_28);
    this_local = (LocalGraph *)&pvVar3->second;
  }
  return (SetInfluences *)this_local;
}

Assistant:

const SetInfluences& getSetInfluences(LocalSet* set) const {
    auto iter = setInfluences.find(set);
    if (iter == setInfluences.end()) {
      // Use a canonical constant empty set to avoid allocation.
      static const SetInfluences empty;
      return empty;
    }
    return iter->second;
  }